

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O1

BlockStatementPtr __thiscall VMState::PushBlock(VMState *this)

{
  enable_shared_from_this<Statement> *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BlockStatement *pBVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long in_RSI;
  BlockStatementPtr BVar5;
  BlockStatement *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  this->m_Parent = *(NutFunction **)(in_RSI + 8);
  peVar2 = *(element_type **)(in_RSI + 0x10);
  (this->m_Block).super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  if (peVar2 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &(peVar2->super_Statement).super_enable_shared_from_this<Statement>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &(peVar2->super_Statement).super_enable_shared_from_this<Statement>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
    }
  }
  pBVar3 = (BlockStatement *)operator_new(0x30);
  (pBVar3->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
  super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (pBVar3->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
  super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pBVar3->super_Statement)._vptr_Statement = (_func_int **)&PTR_GetType_0012dcb0;
  (pBVar3->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar3->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar3->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = pBVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BlockStatement*>
            (a_Stack_30,pBVar3);
  std::__shared_ptr<BlockStatement,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<BlockStatement,BlockStatement>
            ((__shared_ptr<BlockStatement,(__gnu_cxx::_Lock_policy)2> *)&local_38,pBVar3);
  _Var4._M_pi = a_Stack_30[0]._M_pi;
  pBVar3 = local_38;
  local_38 = (BlockStatement *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
  *(BlockStatement **)(in_RSI + 8) = pBVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10) = _Var4._M_pi;
  _Var4._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  BVar5.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  BVar5.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (BlockStatementPtr)BVar5.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BlockStatementPtr PushBlock( void )
	{
		BlockStatementPtr prevBlock = m_Block;
		m_Block = BlockStatementPtr(new BlockStatement);

		return prevBlock;
	}